

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_array.c
# Opt level: O0

void qcc_generate_array_of(qcc_generator_ptr self,void *data)

{
  qcc_generator_ptr self_00;
  void *pvVar1;
  qcc_uint qVar2;
  qcc_context *local_48;
  size_t i;
  uint8_t *item;
  qcc_array *array;
  qcc_generator_ptr item_gen;
  qcc_generator_array_of *array_of;
  qcc_arena *arena;
  void *data_local;
  qcc_generator_ptr self_local;
  
  self_00 = (qcc_generator_ptr)self[1].generate;
  pvVar1 = qcc_arena_alloc(self->context->arena,self_00->type_size * self[1].type_size);
  *(void **)data = pvVar1;
  *(qcc_context **)((long)data + 8) = self[1].context;
  i = *data;
  for (local_48 = (qcc_context *)0x0; local_48 != self[1].context;
      local_48 = (qcc_context *)((long)&local_48->result + 1)) {
    qcc_generate(self_00,(void *)i);
    i = self_00->type_size + i;
  }
  while ((*(ulong *)((long)data + 8) < self[1].type_size &&
         (qVar2 = qcc_stream_get(self->context->stream), (qVar2 & 3) != 0))) {
    qcc_generate(self_00,(void *)i);
    i = self_00->type_size + i;
    *(long *)((long)data + 8) = *(long *)((long)data + 8) + 1;
  }
  return;
}

Assistant:

static void qcc_generate_array_of(qcc_generator_ptr self, void *data)
{
    struct qcc_arena *arena = self->context->arena;
    struct qcc_generator_array_of *array_of =
        (struct qcc_generator_array_of *)self;
    qcc_generator_ptr item_gen = array_of->item_gen;

    struct qcc_array *array = (struct qcc_array *)data;
    array->data =
        qcc_arena_alloc(arena, item_gen->type_size * array_of->size.max);
    array->size = array_of->size.min;

    uint8_t *item = (uint8_t *)array->data;
    for (size_t i = 0; i != array_of->size.min; ++i)
    {
        qcc_generate(item_gen, item);
        item += item_gen->type_size;
    }

    while (array->size < array_of->size.max)
    {
        if (qcc_stream_get(self->context->stream) % 4 == 0) break;
        qcc_generate(item_gen, item);
        item += item_gen->type_size;
        ++array->size;
    }
}